

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

int canvas_undo_font(_glist *x,void *z,int action)

{
  int iVar1;
  float fVar2;
  _glist *x_00;
  t_floatarg local_44;
  t_floatarg local_40;
  t_float realresy;
  t_float realresx;
  t_float realresize;
  int whichresize;
  int tmp_font;
  _glist *x2;
  t_undo_font *u_f;
  int action_local;
  void *z_local;
  _glist *x_local;
  
  if ((action == 1) || (action == 2)) {
    x_00 = canvas_getrootfor(x);
    iVar1 = x_00->gl_font;
    fVar2 = 1.0 / *(float *)((long)z + 4);
    local_40 = 1.0;
    local_44 = 1.0;
    if (*(int *)((long)z + 8) != 3) {
      local_40 = fVar2;
    }
    if (*(int *)((long)z + 8) != 2) {
      local_44 = fVar2;
    }
    canvas_dofont(x_00,(float)*z,local_40,local_44);
    *(float *)((long)z + 4) = fVar2;
    *(int *)z = iVar1;
  }
  else if ((action == 0) && (z != (void *)0x0)) {
    freebytes(z,0xc);
  }
  return 1;
}

Assistant:

int canvas_undo_font(t_canvas *x, void *z, int action)
{
    t_undo_font *u_f = z;

    if (action == UNDO_UNDO || action == UNDO_REDO)
    {
        t_canvas *x2 = canvas_getrootfor(x);
        int tmp_font = x2->gl_font;

        int whichresize = u_f->which;
        t_float realresize = 1./u_f->resize;
        t_float realresx = 1, realresy = 1;
        if (whichresize != 3) realresx = realresize;
        if (whichresize != 2) realresy = realresize;
        canvas_dofont(x2, u_f->font, realresx, realresy);

        u_f->resize = realresize;
        u_f->font = tmp_font;
    }
    else if (action == UNDO_FREE)
    {
        if (u_f)
            freebytes(u_f, sizeof(*u_f));
    }
    return 1;
}